

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_type.h
# Opt level: O3

bool date::rfc1123::write<std::ostreambuf_iterator<char,std::char_traits<char>>>
               (parts *dt,ostreambuf_iterator<char,_std::char_traits<char>_> *dst)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  
  bVar1 = validate(dt);
  if (bVar1) {
    cVar2 = "basic_string::_M_construct null not valid"[(ulong)dt->week_day * 0x18 + 0x17];
    if (cVar2 != '\0') {
      pcVar4 = "basic_string::_M_construct null not valid" + (ulong)dt->week_day * 0x18 + 0x18;
      do {
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,cVar2);
        cVar2 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar2 != '\0');
    }
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,',');
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->day);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    cVar2 = (&DAT_0010a350)[(ulong)dt->month * 0x18];
    if (cVar2 != '\0') {
      pcVar4 = &DAT_0010a351 + (ulong)dt->month * 0x18;
      do {
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,cVar2);
        cVar2 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar2 != '\0');
    }
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    number_writer<4>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_short>
              (dst,dt->year);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->hour);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,':');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->minute);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,':');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->second);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,' ');
    cVar2 = 'G';
    lVar3 = -3;
    do {
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,cVar2);
      cVar2 = (&UNK_0010a4a4)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  return bVar1;
}

Assistant:

static bool write(const parts& dt, Iterator& dst)
    {
        if (!validate(dt))
            return false;

        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto weekday_aliases = weekday_names<char_type>();
        constexpr auto month_aliases = month_names<char_type>();
        constexpr auto zone_aliases = zone_names<char_type>();

        characters_writer::write(dst, weekday_aliases[dt.week_day - 1].first);
        characters_writer::write(dst, char_type{ ',' });
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<2>::write(dst, dt.day);
        characters_writer::write(dst, char_type{ ' ' });
        characters_writer::write(dst, month_aliases[dt.month - 1].first);
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<4>::write(dst, dt.year);
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<2>::write(dst, dt.hour);
        characters_writer::write(dst, char_type{ ':' });
        number_writer<2>::write(dst, dt.minute);
        characters_writer::write(dst, char_type{ ':' });
        number_writer<2>::write(dst, dt.second);
        characters_writer::write(dst, char_type{ ' ' });
        characters_writer::write(dst, zone_aliases[1].first);

        return true;
    }